

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall
cmCTestTestHandler::GenerateRegressionImages(cmCTestTestHandler *this,cmXMLWriter *xml,string *dart)

{
  cmCTest *this_00;
  bool bVar1;
  unsigned_long length;
  ostream *poVar2;
  char *pcVar3;
  size_type sVar4;
  string local_1258 [32];
  undefined1 local_1238 [8];
  ostringstream cmCTestLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10a0;
  allocator<char> local_1079;
  string local_1078;
  string local_1058;
  allocator<char> local_1031;
  string local_1030;
  string local_1010;
  int local_fec;
  undefined1 local_fe8 [4];
  int idx;
  allocator<char> local_fc1;
  string local_fc0;
  ulong local_fa0;
  size_t cc;
  ostringstream ostr;
  string local_e20;
  string local_e00;
  string local_de0;
  string local_dc0;
  allocator<char> local_d99;
  string local_d98;
  size_t local_d78;
  size_t rlen;
  uchar *encoded_buffer;
  uchar *file_buffer;
  ifstream ifs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b38;
  allocator<char> local_b11;
  string local_b10;
  allocator<char> local_ae9;
  string local_ae8;
  string local_ac8;
  string local_aa8;
  undefined1 local_a88 [8];
  string v2;
  string k2;
  string v1;
  string k1;
  long len;
  string local_9e0;
  string *local_9c0;
  string *filename;
  allocator<char> local_991;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  allocator<char> local_8e9;
  string local_8e8;
  string local_8c8;
  allocator<char> local_8a1;
  string local_8a0;
  string local_880;
  string local_860;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  allocator<char> local_779;
  string local_778;
  string local_758;
  allocator<char> local_731;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  allocator<char> local_649;
  string local_648;
  string local_628;
  allocator<char> local_601;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  allocator<char> local_559;
  string local_558;
  undefined1 local_538 [8];
  string cxml;
  undefined1 local_510 [7];
  bool done;
  RegularExpression measurementfile;
  RegularExpression cdataend;
  RegularExpression cdatastart;
  RegularExpression fourattributes;
  undefined1 local_1c0 [8];
  RegularExpression threeattributes;
  RegularExpression twoattributes;
  string *dart_local;
  cmXMLWriter *xml_local;
  cmCTestTestHandler *this_local;
  
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&threeattributes.progsize,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurement>"
            );
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)local_1c0,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurement>"
            );
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&cdatastart.progsize,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurement>"
            );
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&cdataend.progsize,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>[ \t\r\n]*<!\\[CDATA\\["
            );
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&measurementfile.progsize,"]]>[ \t\r\n]*</DartMeasurement>");
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)local_510,
             "<DartMeasurementFile[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurementFile>"
            );
  cxml.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)local_538,(string *)dart);
  while (((cxml.field_2._M_local_buf[0xf] ^ 0xffU) & 1) != 0) {
    bVar1 = cmsys::RegularExpression::find
                      ((RegularExpression *)&threeattributes.progsize,(string *)local_538);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_558,"NamedMeasurement",&local_559);
      cmXMLWriter::StartElement(xml,&local_558);
      std::__cxx11::string::~string((string *)&local_558);
      std::allocator<char>::~allocator(&local_559);
      cmsys::RegularExpression::match_abi_cxx11_
                (&local_580,(RegularExpression *)&threeattributes.progsize,1);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmsys::RegularExpression::match_abi_cxx11_
                (&local_5a0,(RegularExpression *)&threeattributes.progsize,2);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,pcVar3,&local_5a0);
      std::__cxx11::string::~string((string *)&local_5a0);
      std::__cxx11::string::~string((string *)&local_580);
      cmsys::RegularExpression::match_abi_cxx11_
                (&local_5c0,(RegularExpression *)&threeattributes.progsize,3);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmsys::RegularExpression::match_abi_cxx11_
                (&local_5e0,(RegularExpression *)&threeattributes.progsize,4);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,pcVar3,&local_5e0);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::__cxx11::string::~string((string *)&local_5c0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,"Value",&local_601);
      cmsys::RegularExpression::match_abi_cxx11_
                (&local_628,(RegularExpression *)&threeattributes.progsize,5);
      cmXMLWriter::Element<std::__cxx11::string>(xml,&local_600,&local_628);
      std::__cxx11::string::~string((string *)&local_628);
      std::__cxx11::string::~string((string *)&local_600);
      std::allocator<char>::~allocator(&local_601);
      cmXMLWriter::EndElement(xml);
      sVar4 = cmsys::RegularExpression::start((RegularExpression *)&threeattributes.progsize);
      cmsys::RegularExpression::end((RegularExpression *)&threeattributes.progsize);
      cmsys::RegularExpression::start((RegularExpression *)&threeattributes.progsize);
      std::__cxx11::string::erase((ulong)local_538,sVar4);
    }
    else {
      bVar1 = cmsys::RegularExpression::find((RegularExpression *)local_1c0,(string *)local_538);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_648,"NamedMeasurement",&local_649);
        cmXMLWriter::StartElement(xml,&local_648);
        std::__cxx11::string::~string((string *)&local_648);
        std::allocator<char>::~allocator(&local_649);
        cmsys::RegularExpression::match_abi_cxx11_(&local_670,(RegularExpression *)local_1c0,1);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmsys::RegularExpression::match_abi_cxx11_(&local_690,(RegularExpression *)local_1c0,2);
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,pcVar3,&local_690);
        std::__cxx11::string::~string((string *)&local_690);
        std::__cxx11::string::~string((string *)&local_670);
        cmsys::RegularExpression::match_abi_cxx11_(&local_6b0,(RegularExpression *)local_1c0,3);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmsys::RegularExpression::match_abi_cxx11_(&local_6d0,(RegularExpression *)local_1c0,4);
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,pcVar3,&local_6d0);
        std::__cxx11::string::~string((string *)&local_6d0);
        std::__cxx11::string::~string((string *)&local_6b0);
        cmsys::RegularExpression::match_abi_cxx11_(&local_6f0,(RegularExpression *)local_1c0,5);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmsys::RegularExpression::match_abi_cxx11_(&local_710,(RegularExpression *)local_1c0,6);
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,pcVar3,&local_710);
        std::__cxx11::string::~string((string *)&local_710);
        std::__cxx11::string::~string((string *)&local_6f0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"Value",&local_731);
        cmsys::RegularExpression::match_abi_cxx11_
                  (&local_758,(RegularExpression *)&threeattributes.progsize,7);
        cmXMLWriter::Element<std::__cxx11::string>(xml,&local_730,&local_758);
        std::__cxx11::string::~string((string *)&local_758);
        std::__cxx11::string::~string((string *)&local_730);
        std::allocator<char>::~allocator(&local_731);
        cmXMLWriter::EndElement(xml);
        sVar4 = cmsys::RegularExpression::start((RegularExpression *)local_1c0);
        cmsys::RegularExpression::end((RegularExpression *)local_1c0);
        cmsys::RegularExpression::start((RegularExpression *)local_1c0);
        std::__cxx11::string::erase((ulong)local_538,sVar4);
      }
      else {
        bVar1 = cmsys::RegularExpression::find
                          ((RegularExpression *)&cdatastart.progsize,(string *)local_538);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_778,"NamedMeasurement",&local_779);
          cmXMLWriter::StartElement(xml,&local_778);
          std::__cxx11::string::~string((string *)&local_778);
          std::allocator<char>::~allocator(&local_779);
          cmsys::RegularExpression::match_abi_cxx11_
                    (&local_7a0,(RegularExpression *)&cdatastart.progsize,1);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          cmsys::RegularExpression::match_abi_cxx11_
                    (&local_7c0,(RegularExpression *)&cdatastart.progsize,2);
          cmXMLWriter::Attribute<std::__cxx11::string>(xml,pcVar3,&local_7c0);
          std::__cxx11::string::~string((string *)&local_7c0);
          std::__cxx11::string::~string((string *)&local_7a0);
          cmsys::RegularExpression::match_abi_cxx11_
                    (&local_7e0,(RegularExpression *)&cdatastart.progsize,3);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          cmsys::RegularExpression::match_abi_cxx11_
                    (&local_800,(RegularExpression *)&cdatastart.progsize,4);
          cmXMLWriter::Attribute<std::__cxx11::string>(xml,pcVar3,&local_800);
          std::__cxx11::string::~string((string *)&local_800);
          std::__cxx11::string::~string((string *)&local_7e0);
          cmsys::RegularExpression::match_abi_cxx11_
                    (&local_820,(RegularExpression *)&cdatastart.progsize,5);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          cmsys::RegularExpression::match_abi_cxx11_
                    (&local_840,(RegularExpression *)&cdatastart.progsize,6);
          cmXMLWriter::Attribute<std::__cxx11::string>(xml,pcVar3,&local_840);
          std::__cxx11::string::~string((string *)&local_840);
          std::__cxx11::string::~string((string *)&local_820);
          cmsys::RegularExpression::match_abi_cxx11_
                    (&local_860,(RegularExpression *)&cdatastart.progsize,7);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          cmsys::RegularExpression::match_abi_cxx11_
                    (&local_880,(RegularExpression *)&cdatastart.progsize,8);
          cmXMLWriter::Attribute<std::__cxx11::string>(xml,pcVar3,&local_880);
          std::__cxx11::string::~string((string *)&local_880);
          std::__cxx11::string::~string((string *)&local_860);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8a0,"Value",&local_8a1);
          cmsys::RegularExpression::match_abi_cxx11_
                    (&local_8c8,(RegularExpression *)&threeattributes.progsize,9);
          cmXMLWriter::Element<std::__cxx11::string>(xml,&local_8a0,&local_8c8);
          std::__cxx11::string::~string((string *)&local_8c8);
          std::__cxx11::string::~string((string *)&local_8a0);
          std::allocator<char>::~allocator(&local_8a1);
          cmXMLWriter::EndElement(xml);
          sVar4 = cmsys::RegularExpression::start((RegularExpression *)&cdatastart.progsize);
          cmsys::RegularExpression::end((RegularExpression *)&cdatastart.progsize);
          cmsys::RegularExpression::start((RegularExpression *)&cdatastart.progsize);
          std::__cxx11::string::erase((ulong)local_538,sVar4);
        }
        else {
          bVar1 = cmsys::RegularExpression::find
                            ((RegularExpression *)&cdataend.progsize,(string *)local_538);
          if ((bVar1) &&
             (bVar1 = cmsys::RegularExpression::find
                                ((RegularExpression *)&measurementfile.progsize,(string *)local_538)
             , bVar1)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_8e8,"NamedMeasurement",&local_8e9);
            cmXMLWriter::StartElement(xml,&local_8e8);
            std::__cxx11::string::~string((string *)&local_8e8);
            std::allocator<char>::~allocator(&local_8e9);
            cmsys::RegularExpression::match_abi_cxx11_
                      (&local_910,(RegularExpression *)&cdataend.progsize,1);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            cmsys::RegularExpression::match_abi_cxx11_
                      (&local_930,(RegularExpression *)&cdataend.progsize,2);
            cmXMLWriter::Attribute<std::__cxx11::string>(xml,pcVar3,&local_930);
            std::__cxx11::string::~string((string *)&local_930);
            std::__cxx11::string::~string((string *)&local_910);
            cmsys::RegularExpression::match_abi_cxx11_
                      (&local_950,(RegularExpression *)&cdataend.progsize,3);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            cmsys::RegularExpression::match_abi_cxx11_
                      (&local_970,(RegularExpression *)&cdataend.progsize,4);
            cmXMLWriter::Attribute<std::__cxx11::string>(xml,pcVar3,&local_970);
            std::__cxx11::string::~string((string *)&local_970);
            std::__cxx11::string::~string((string *)&local_950);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_990,"Value",&local_991);
            cmXMLWriter::StartElement(xml,&local_990);
            std::__cxx11::string::~string((string *)&local_990);
            std::allocator<char>::~allocator(&local_991);
            cmsys::RegularExpression::end((RegularExpression *)&cdataend.progsize);
            cmsys::RegularExpression::start((RegularExpression *)&measurementfile.progsize);
            cmsys::RegularExpression::end((RegularExpression *)&cdataend.progsize);
            std::__cxx11::string::substr((ulong)&filename,(ulong)local_538);
            cmXMLWriter::CData(xml,(string *)&filename);
            std::__cxx11::string::~string((string *)&filename);
            cmXMLWriter::EndElement(xml);
            cmXMLWriter::EndElement(xml);
            sVar4 = cmsys::RegularExpression::start((RegularExpression *)&cdataend.progsize);
            cmsys::RegularExpression::end((RegularExpression *)&measurementfile.progsize);
            cmsys::RegularExpression::start((RegularExpression *)&cdataend.progsize);
            std::__cxx11::string::erase((ulong)local_538,sVar4);
          }
          else {
            bVar1 = cmsys::RegularExpression::find
                              ((RegularExpression *)local_510,(string *)local_538);
            if (bVar1) {
              cmsys::RegularExpression::match_abi_cxx11_
                        ((string *)&len,(RegularExpression *)local_510,5);
              cmCTest::CleanString(&local_9e0,(string *)&len);
              std::__cxx11::string::~string((string *)&len);
              local_9c0 = &local_9e0;
              bVar1 = cmsys::SystemTools::FileExists(local_9c0);
              if (bVar1) {
                length = cmsys::SystemTools::FileLength(local_9c0);
                if (length == 0) {
                  cmsys::RegularExpression::match_abi_cxx11_
                            ((string *)((long)&v1.field_2 + 8),(RegularExpression *)local_510,1);
                  cmsys::RegularExpression::match_abi_cxx11_
                            ((string *)((long)&k2.field_2 + 8),(RegularExpression *)local_510,2);
                  cmsys::RegularExpression::match_abi_cxx11_
                            ((string *)((long)&v2.field_2 + 8),(RegularExpression *)local_510,3);
                  cmsys::RegularExpression::match_abi_cxx11_
                            ((string *)local_a88,(RegularExpression *)local_510,4);
                  cmsys::SystemTools::LowerCase(&local_aa8,(string *)((long)&v1.field_2 + 8));
                  bVar1 = std::operator==(&local_aa8,"type");
                  std::__cxx11::string::~string((string *)&local_aa8);
                  if (bVar1) {
                    std::__cxx11::string::operator=
                              ((string *)(k2.field_2._M_local_buf + 8),"text/string");
                  }
                  cmsys::SystemTools::LowerCase(&local_ac8,(string *)((long)&v2.field_2 + 8));
                  bVar1 = std::operator==(&local_ac8,"type");
                  std::__cxx11::string::~string((string *)&local_ac8);
                  if (bVar1) {
                    std::__cxx11::string::operator=((string *)local_a88,"text/string");
                  }
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_ae8,"NamedMeasurement",&local_ae9);
                  cmXMLWriter::StartElement(xml,&local_ae8);
                  std::__cxx11::string::~string((string *)&local_ae8);
                  std::allocator<char>::~allocator(&local_ae9);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  cmXMLWriter::Attribute<std::__cxx11::string>
                            (xml,pcVar3,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&k2.field_2 + 8));
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  cmXMLWriter::Attribute<std::__cxx11::string>
                            (xml,pcVar3,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_a88);
                  cmXMLWriter::Attribute<char[5]>(xml,"encoding",(char (*) [5])0x84e23a);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_b10,"Value",&local_b11);
                  std::operator+(&local_b58,"Image ",local_9c0);
                  std::operator+(&local_b38,&local_b58," is empty");
                  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_b10,&local_b38);
                  std::__cxx11::string::~string((string *)&local_b38);
                  std::__cxx11::string::~string((string *)&local_b58);
                  std::__cxx11::string::~string((string *)&local_b10);
                  std::allocator<char>::~allocator(&local_b11);
                  cmXMLWriter::EndElement(xml);
                  std::__cxx11::string::~string((string *)local_a88);
                  std::__cxx11::string::~string((string *)(v2.field_2._M_local_buf + 8));
                  std::__cxx11::string::~string((string *)(k2.field_2._M_local_buf + 8));
                  std::__cxx11::string::~string((string *)(v1.field_2._M_local_buf + 8));
                }
                else {
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  std::ifstream::ifstream(&file_buffer,pcVar3,_S_in);
                  encoded_buffer = (uchar *)operator_new__(length + 1);
                  std::istream::read((char *)&file_buffer,(long)encoded_buffer);
                  rlen = (size_t)operator_new__((long)(int)((double)(long)length * 1.5 + 5.0));
                  local_d78 = cmsysBase64_Encode(encoded_buffer,length,(uchar *)rlen,1);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_d98,"NamedMeasurement",&local_d99);
                  cmXMLWriter::StartElement(xml,&local_d98);
                  std::__cxx11::string::~string((string *)&local_d98);
                  std::allocator<char>::~allocator(&local_d99);
                  cmsys::RegularExpression::match_abi_cxx11_
                            (&local_dc0,(RegularExpression *)local_510,1);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  cmsys::RegularExpression::match_abi_cxx11_
                            (&local_de0,(RegularExpression *)local_510,2);
                  cmXMLWriter::Attribute<std::__cxx11::string>(xml,pcVar3,&local_de0);
                  std::__cxx11::string::~string((string *)&local_de0);
                  std::__cxx11::string::~string((string *)&local_dc0);
                  cmsys::RegularExpression::match_abi_cxx11_
                            (&local_e00,(RegularExpression *)local_510,3);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  cmsys::RegularExpression::match_abi_cxx11_
                            (&local_e20,(RegularExpression *)local_510,4);
                  cmXMLWriter::Attribute<std::__cxx11::string>(xml,pcVar3,&local_e20);
                  std::__cxx11::string::~string((string *)&local_e20);
                  std::__cxx11::string::~string((string *)&local_e00);
                  cmXMLWriter::Attribute<char[7]>(xml,"encoding",(char (*) [7])"base64");
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cc);
                  for (local_fa0 = 0; local_fa0 < local_d78; local_fa0 = local_fa0 + 1) {
                    std::operator<<((ostream *)&cc,*(uchar *)(rlen + local_fa0));
                    if ((local_fa0 % 0x3c == 0) && (local_fa0 != 0)) {
                      std::ostream::operator<<(&cc,std::endl<char,std::char_traits<char>>);
                    }
                  }
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_fc0,"Value",&local_fc1);
                  std::__cxx11::ostringstream::str();
                  cmXMLWriter::Element<std::__cxx11::string>
                            (xml,&local_fc0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_fe8);
                  std::__cxx11::string::~string((string *)local_fe8);
                  std::__cxx11::string::~string((string *)&local_fc0);
                  std::allocator<char>::~allocator(&local_fc1);
                  cmXMLWriter::EndElement(xml);
                  if (encoded_buffer != (uchar *)0x0) {
                    operator_delete__(encoded_buffer);
                  }
                  if (rlen != 0) {
                    operator_delete__((void *)rlen);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cc);
                  std::ifstream::~ifstream(&file_buffer);
                }
              }
              else {
                local_fec = 4;
                cmsys::RegularExpression::match_abi_cxx11_
                          (&local_1010,(RegularExpression *)local_510,1);
                bVar1 = std::operator==(&local_1010,"name");
                std::__cxx11::string::~string((string *)&local_1010);
                if (bVar1) {
                  local_fec = 2;
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1030,"NamedMeasurement",&local_1031);
                cmXMLWriter::StartElement(xml,&local_1030);
                std::__cxx11::string::~string((string *)&local_1030);
                std::allocator<char>::~allocator(&local_1031);
                cmsys::RegularExpression::match_abi_cxx11_
                          (&local_1058,(RegularExpression *)local_510,local_fec);
                cmXMLWriter::Attribute<std::__cxx11::string>(xml,"name",&local_1058);
                std::__cxx11::string::~string((string *)&local_1058);
                cmXMLWriter::Attribute<char[12]>(xml,"text",(char (*) [12])"text/string");
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1078,"Value",&local_1079);
                std::operator+(&local_10c0,"File ",local_9c0);
                std::operator+(&local_10a0,&local_10c0," not found");
                cmXMLWriter::Element<std::__cxx11::string>(xml,&local_1078,&local_10a0);
                std::__cxx11::string::~string((string *)&local_10a0);
                std::__cxx11::string::~string((string *)&local_10c0);
                std::__cxx11::string::~string((string *)&local_1078);
                std::allocator<char>::~allocator(&local_1079);
                cmXMLWriter::EndElement(xml);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1238);
                poVar2 = std::operator<<((ostream *)local_1238,"File \"");
                poVar2 = std::operator<<(poVar2,(string *)local_9c0);
                poVar2 = std::operator<<(poVar2,"\" not found.");
                std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                this_00 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::ostringstream::str();
                pcVar3 = (char *)std::__cxx11::string::c_str();
                cmCTest::Log(this_00,2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                             ,0x7fe,pcVar3,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
                std::__cxx11::string::~string(local_1258);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1238);
              }
              sVar4 = cmsys::RegularExpression::start((RegularExpression *)local_510);
              cmsys::RegularExpression::end((RegularExpression *)local_510);
              cmsys::RegularExpression::start((RegularExpression *)local_510);
              std::__cxx11::string::erase((ulong)local_538,sVar4);
              std::__cxx11::string::~string((string *)&local_9e0);
            }
            else {
              cxml.field_2._M_local_buf[0xf] = '\x01';
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_538);
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_510);
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)&measurementfile.progsize);
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)&cdataend.progsize);
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)&cdatastart.progsize);
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_1c0);
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)&threeattributes.progsize);
  return;
}

Assistant:

void cmCTestTestHandler::GenerateRegressionImages(cmXMLWriter& xml,
                                                  const std::string& dart)
{
  cmsys::RegularExpression twoattributes(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurement>");
  cmsys::RegularExpression threeattributes(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurement>");
  cmsys::RegularExpression fourattributes(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurement>");
  cmsys::RegularExpression cdatastart(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>" SPACE_REGEX "*<!\\[CDATA\\[");
  cmsys::RegularExpression cdataend("]]>" SPACE_REGEX "*</DartMeasurement>");
  cmsys::RegularExpression measurementfile(
    "<DartMeasurementFile" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurementFile>");

  bool done = false;
  std::string cxml = dart;
  while (!done) {
    if (twoattributes.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(twoattributes.match(1).c_str(), twoattributes.match(2));
      xml.Attribute(twoattributes.match(3).c_str(), twoattributes.match(4));
      xml.Element("Value", twoattributes.match(5));
      xml.EndElement();
      cxml.erase(twoattributes.start(),
                 twoattributes.end() - twoattributes.start());
    } else if (threeattributes.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(threeattributes.match(1).c_str(),
                    threeattributes.match(2));
      xml.Attribute(threeattributes.match(3).c_str(),
                    threeattributes.match(4));
      xml.Attribute(threeattributes.match(5).c_str(),
                    threeattributes.match(6));
      xml.Element("Value", twoattributes.match(7));
      xml.EndElement();
      cxml.erase(threeattributes.start(),
                 threeattributes.end() - threeattributes.start());
    } else if (fourattributes.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(fourattributes.match(1).c_str(), fourattributes.match(2));
      xml.Attribute(fourattributes.match(3).c_str(), fourattributes.match(4));
      xml.Attribute(fourattributes.match(5).c_str(), fourattributes.match(6));
      xml.Attribute(fourattributes.match(7).c_str(), fourattributes.match(8));
      xml.Element("Value", twoattributes.match(9));
      xml.EndElement();
      cxml.erase(fourattributes.start(),
                 fourattributes.end() - fourattributes.start());
    } else if (cdatastart.find(cxml) && cdataend.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(cdatastart.match(1).c_str(), cdatastart.match(2));
      xml.Attribute(cdatastart.match(3).c_str(), cdatastart.match(4));
      xml.StartElement("Value");
      xml.CData(
        cxml.substr(cdatastart.end(), cdataend.start() - cdatastart.end()));
      xml.EndElement(); // Value
      xml.EndElement(); // NamedMeasurement
      cxml.erase(cdatastart.start(), cdataend.end() - cdatastart.start());
    } else if (measurementfile.find(cxml)) {
      const std::string& filename =
        cmCTest::CleanString(measurementfile.match(5));
      if (cmSystemTools::FileExists(filename)) {
        long len = cmSystemTools::FileLength(filename);
        if (len == 0) {
          std::string k1 = measurementfile.match(1);
          std::string v1 = measurementfile.match(2);
          std::string k2 = measurementfile.match(3);
          std::string v2 = measurementfile.match(4);
          if (cmSystemTools::LowerCase(k1) == "type") {
            v1 = "text/string";
          }
          if (cmSystemTools::LowerCase(k2) == "type") {
            v2 = "text/string";
          }

          xml.StartElement("NamedMeasurement");
          xml.Attribute(k1.c_str(), v1);
          xml.Attribute(k2.c_str(), v2);
          xml.Attribute("encoding", "none");
          xml.Element("Value", "Image " + filename + " is empty");
          xml.EndElement();
        } else {
          cmsys::ifstream ifs(filename.c_str(),
                              std::ios::in
#ifdef _WIN32
                                | std::ios::binary
#endif
          );
          unsigned char* file_buffer = new unsigned char[len + 1];
          ifs.read(reinterpret_cast<char*>(file_buffer), len);
          unsigned char* encoded_buffer = new unsigned char[static_cast<int>(
            static_cast<double>(len) * 1.5 + 5.0)];

          size_t rlen =
            cmsysBase64_Encode(file_buffer, len, encoded_buffer, 1);

          xml.StartElement("NamedMeasurement");
          xml.Attribute(measurementfile.match(1).c_str(),
                        measurementfile.match(2));
          xml.Attribute(measurementfile.match(3).c_str(),
                        measurementfile.match(4));
          xml.Attribute("encoding", "base64");
          std::ostringstream ostr;
          for (size_t cc = 0; cc < rlen; cc++) {
            ostr << encoded_buffer[cc];
            if (cc % 60 == 0 && cc) {
              ostr << std::endl;
            }
          }
          xml.Element("Value", ostr.str());
          xml.EndElement(); // NamedMeasurement
          delete[] file_buffer;
          delete[] encoded_buffer;
        }
      } else {
        int idx = 4;
        if (measurementfile.match(1) == "name") {
          idx = 2;
        }
        xml.StartElement("NamedMeasurement");
        xml.Attribute("name", measurementfile.match(idx));
        xml.Attribute("text", "text/string");
        xml.Element("Value", "File " + filename + " not found");
        xml.EndElement();
        cmCTestOptionalLog(
          this->CTest, HANDLER_OUTPUT,
          "File \"" << filename << "\" not found." << std::endl, this->Quiet);
      }
      cxml.erase(measurementfile.start(),
                 measurementfile.end() - measurementfile.start());
    } else {
      done = true;
    }
  }
}